

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O2

void __thiscall NoiseSource::NoiseSource(NoiseSource *this,Time *time,int n)

{
  Noise **ppNVar1;
  ulong uVar2;
  double **ppdVar3;
  double *pdVar4;
  int j;
  int i;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_71);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Stochastic",&local_72);
  StochasticProcess::StochasticProcess(&this->super_StochasticProcess,time,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  RandN::RandN((RandN *)this);
  (this->super_StochasticProcess).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__NoiseSource_001562b8;
  (this->super_StochasticProcess).super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__NoiseSource_00156340;
  (this->super_StochasticProcess).super_Physical._vptr_Physical =
       (_func_int **)&PTR__NoiseSource_00156388;
  this->nNoises = n;
  uVar5 = (ulong)(uint)n << 3;
  if (n < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  ppNVar1 = (Noise **)operator_new__(uVar5);
  this->aNoises = ppNVar1;
  uVar2 = 0;
  uVar6 = 0;
  if (0 < n) {
    uVar6 = (ulong)(uint)n;
  }
  for (; uVar6 != uVar2; uVar2 = uVar2 + 1) {
    this->aNoises[uVar2] = (Noise *)0x0;
  }
  ppdVar3 = (double **)operator_new__(uVar5);
  this->aA = ppdVar3;
  uVar5 = 0;
  while( true ) {
    uVar2 = (long)n * 8;
    if (n < 0) {
      uVar2 = 0xffffffffffffffff;
    }
    if (uVar5 == uVar6) break;
    pdVar4 = (double *)operator_new__(uVar2);
    this->aA[uVar5] = pdVar4;
    for (uVar2 = 0; (long)uVar2 < (long)n; uVar2 = uVar2 + 1) {
      if (uVar5 == uVar2) {
        dVar7 = (double)n;
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        this->aA[uVar5][uVar5] = 1.0 / dVar7;
        n = this->nNoises;
      }
      else {
        this->aA[uVar5][uVar2] = 0.0;
      }
    }
    uVar5 = uVar5 + 1;
  }
  pdVar4 = (double *)operator_new__(uVar2);
  this->aOmega = pdVar4;
  for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    dVar7 = RandN::dRandN((RandN *)this);
    this->aOmega[uVar5] = dVar7;
  }
  return;
}

Assistant:

NoiseSource::NoiseSource( Time *time,  int n )
	: StochasticProcess(time)
{
	nNoises = n;
	
	// noise array
	aNoises = new Noise *[nNoises];
	for(int i=0; i<n; i++)
		aNoises[i] = 0;
	
	// mixing array
	aA = new double *[nNoises];
	for(int i=0; i<n; i++) {
		aA[i] = new double[nNoises];
		for(int j=0; j<nNoises; j++)
			if (i==j)
				aA[i][j] = 1.0 / sqrt( double(nNoises) );
			else
				aA[i][j] = 0.0;
	}
	
	// omega array
	aOmega = new double[nNoises];
	for(int i=0; i<n; i++)
		aOmega[i] = dRandN();	
}